

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::
         format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
                   (char *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   uint *args_4)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostream *in_R9;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [3];
  uint *in_stack_fffffffffffffef0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_1_00 = local_180;
  args_2_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)args_1_00);
  format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
            (in_R9,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,args_1_00,args_2_00,in_RDI,
             in_stack_fffffffffffffef0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_2_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}